

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLIListener.cpp
# Opt level: O1

void __thiscall CLIListener::do_fetch(CLIListener *this,Poll *p,string *arg)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  pointer pcVar1;
  uint64_t uVar2;
  MultiQuery<dto::Simple,_dto::Complex> *this_01;
  code *pcVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  ostream *poVar6;
  long lVar7;
  char *pcVar8;
  shared_ptr<MultiQuery<dto::Simple,_dto::Complex>_> query;
  mapped_type addr;
  Simple dto;
  MultiQuery<dto::Simple,_dto::Complex> *local_160;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  code *local_130;
  undefined8 uStack_128;
  unsigned_short local_120;
  undefined6 uStack_11e;
  undefined1 *local_118;
  undefined8 local_110;
  undefined1 local_108;
  undefined7 uStack_107;
  undefined8 uStack_100;
  Poll *local_f8;
  CLIListener *local_f0;
  shared_ptr<Subscriber> local_e8;
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  undefined1 local_98 [24];
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  OnError local_58;
  
  this_00 = &this->file_server;
  iVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,arg);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    pcVar8 = "Could not find a server to fetch from, execute search first";
    lVar7 = 0x3b;
    poVar6 = (ostream *)&std::cout;
  }
  else {
    iVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&this_00->_M_h,arg);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      pmVar5 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_00,arg);
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      pcVar1 = (pmVar5->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_150,pcVar1,pcVar1 + pmVar5->_M_string_length);
      uVar2 = this->cmd_seq;
      this->cmd_seq = uVar2 + 1;
      local_d8 = local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"GET","");
      local_130 = (code *)&local_120;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,local_d8,local_d0 + (long)local_d8);
      local_80._M_p = (pointer)&local_70;
      local_98._10_6_ = 0;
      local_98._16_2_ = 0;
      local_78 = 0;
      local_70._M_local_buf[0] = '\0';
      local_98[0] = '\0';
      local_98[1] = '\0';
      local_98[2] = '\0';
      local_98[3] = '\0';
      local_98[4] = '\0';
      local_98[5] = '\0';
      local_98[6] = '\0';
      local_98[7] = '\0';
      local_98[8] = '\0';
      local_98[9] = '\0';
      std::__cxx11::string::operator=((string *)&local_80,(string *)arg);
      pcVar3 = local_130;
      strcpy(local_98,(char *)local_130);
      local_98._10_6_ = (undefined6)uVar2;
      local_98._16_2_ = (undefined2)(uVar2 >> 0x30);
      if (pcVar3 != (code *)&local_120) {
        operator_delete(pcVar3,CONCAT62(uStack_11e,local_120) + 1);
      }
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
      local_160 = (MultiQuery<dto::Simple,_dto::Complex> *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<MultiQuery<dto::Simple,dto::Complex>,std::allocator<MultiQuery<dto::Simple,dto::Complex>>,dto::Simple&,unsigned_short&,std::__cxx11::string&,int_const&>
                (&local_158,&local_160,
                 (allocator<MultiQuery<dto::Simple,_dto::Complex>_> *)&local_130,(Simple *)local_98,
                 &this->port,&local_150,&LONG_TIMEOUT_MILLIS);
      local_e8.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &local_160->super_Subscriber;
      local_e8.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_158._M_pi;
      if (local_158._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_158._M_pi)->_M_use_count = (local_158._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_158._M_pi)->_M_use_count = (local_158._M_pi)->_M_use_count + 1;
        }
      }
      Poll::subscribe(p,&local_e8);
      if (local_e8.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_e8.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      this_01 = local_160;
      local_130 = on_fetch_result;
      uStack_128 = 0;
      local_120 = this->port;
      local_118 = &local_108;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_118,local_150._M_dataplus._M_p,
                 local_150._M_dataplus._M_p + local_150._M_string_length);
      local_b8._M_unused._M_object = (void *)0x0;
      local_b8._8_8_ = 0;
      local_a8 = (code *)0x0;
      pcStack_a0 = (code *)0x0;
      local_f8 = p;
      local_f0 = this;
      local_b8._M_unused._M_object = operator_new(0x48);
      *(code **)local_b8._M_unused._0_8_ = local_130;
      *(undefined8 *)((long)local_b8._M_unused._0_8_ + 8) = uStack_128;
      *(unsigned_short *)((long)local_b8._M_unused._0_8_ + 0x10) = local_120;
      *(code **)((long)local_b8._M_unused._0_8_ + 0x18) =
           (code *)((long)local_b8._M_unused._0_8_ + 0x28);
      if (local_118 == &local_108) {
        *(ulong *)((long)local_b8._M_unused._0_8_ + 0x28) = CONCAT71(uStack_107,local_108);
        *(undefined8 *)((long)local_b8._M_unused._0_8_ + 0x30) = uStack_100;
      }
      else {
        *(undefined1 **)((long)local_b8._M_unused._0_8_ + 0x18) = local_118;
        *(ulong *)((long)local_b8._M_unused._0_8_ + 0x28) = CONCAT71(uStack_107,local_108);
      }
      *(undefined8 *)((long)local_b8._M_unused._0_8_ + 0x20) = local_110;
      local_110 = 0;
      local_108 = 0;
      *(Poll **)((long)local_b8._M_unused._0_8_ + 0x38) = local_f8;
      *(CLIListener **)((long)local_b8._M_unused._0_8_ + 0x40) = local_f0;
      pcStack_a0 = std::
                   _Function_handler<void_(dto::Complex_&,_sockaddr_in),_std::_Bind<void_(CLIListener::*(CLIListener_*,_std::reference_wrapper<Poll>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short))(Poll_&,_dto::Complex_&,_sockaddr_in,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short)>_>
                   ::_M_invoke;
      local_a8 = std::
                 _Function_handler<void_(dto::Complex_&,_sockaddr_in),_std::_Bind<void_(CLIListener::*(CLIListener_*,_std::reference_wrapper<Poll>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short))(Poll_&,_dto::Complex_&,_sockaddr_in,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short)>_>
                 ::_M_manager;
      local_118 = &local_108;
      MultiQuery<dto::Simple,_dto::Complex>::when_response(this_01,(OnResponse *)&local_b8);
      if (local_a8 != (code *)0x0) {
        (*local_a8)(&local_b8,&local_b8,__destroy_functor);
      }
      if (local_118 != &local_108) {
        operator_delete(local_118,CONCAT71(uStack_107,local_108) + 1);
      }
      local_58.super__Function_base._M_functor._8_8_ = 0;
      local_58.super__Function_base._M_functor._M_unused._M_object = request_failed;
      local_58._M_invoker = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
      local_58.super__Function_base._M_manager =
           std::_Function_handler<void_(),_void_(*)()>::_M_manager;
      MultiQuery<dto::Simple,_dto::Complex>::when_error(local_160,&local_58);
      if (local_58.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_58.super__Function_base._M_manager)
                  ((_Any_data *)&local_58,(_Any_data *)&local_58,__destroy_functor);
      }
      if (local_158._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_158._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_p != &local_70) {
        operator_delete(local_80._M_p,
                        CONCAT71(local_70._M_allocated_capacity._1_7_,local_70._M_local_buf[0]) + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not found file ",0xf);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(arg->_M_dataplus)._M_p,arg->_M_string_length);
    pcVar8 = " in search results";
    lVar7 = 0x12;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar8,lVar7);
  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  return;
}

Assistant:

void CLIListener::do_fetch(Poll &p, std::string &arg) {
  if (file_server.find(arg) == file_server.end()) {
    std::cout << "Could not find a server to fetch from, execute search first" << std::endl;
    return;
  }
  if (file_server.find(arg) == file_server.end()) {
    std::cout << "Not found file " << arg << " in search results" << std::endl;
    return;
  }
  auto addr = file_server[arg];
  auto dto = dto::create(cmd_seq++, "GET", arg);
  auto query = std::make_shared<MultiQuery<dto::Simple, dto::Complex>>(dto, port, addr, LONG_TIMEOUT_MILLIS);
  p.subscribe(query);
  query->when_response(std::bind(&CLIListener::on_fetch_result, this, std::ref(p), _1, _2, addr, port));
  query->when_error(request_failed);
}